

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait.cpp
# Opt level: O0

DWORD QueueUserAPC(PAPCFUNC pfnAPC,HANDLE hThread,ULONG_PTR dwData)

{
  PAL_ERROR local_3c;
  DWORD dwRet;
  PAL_ERROR palErr;
  IPalObject *pTargetThreadObject;
  CPalThread *pTargetThread;
  CPalThread *pCurrentThread;
  ULONG_PTR dwData_local;
  HANDLE hThread_local;
  PAPCFUNC pfnAPC_local;
  
  pTargetThread = (CPalThread *)0x0;
  pTargetThreadObject = (IPalObject *)0x0;
  _dwRet = (IPalObject *)0x0;
  pCurrentThread = (CPalThread *)dwData;
  dwData_local = (ULONG_PTR)hThread;
  hThread_local = pfnAPC;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  pTargetThread = CorUnix::InternalGetCurrentThread();
  local_3c = CorUnix::InternalGetThreadDataFromHandle
                       (pTargetThread,(HANDLE)dwData_local,0,(CPalThread **)&pTargetThreadObject,
                        (IPalObject **)&dwRet);
  if (local_3c == 0) {
    local_3c = (**(code **)(*CorUnix::g_pSynchronizationManager + 0x10))
                         (CorUnix::g_pSynchronizationManager,pTargetThread,pTargetThreadObject,
                          hThread_local,pCurrentThread);
  }
  else if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  if (_dwRet != (IPalObject *)0x0) {
    (*_dwRet->_vptr_IPalObject[8])(_dwRet,pTargetThread);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return (uint)(local_3c == 0);
}

Assistant:

DWORD
PALAPI
QueueUserAPC(
    PAPCFUNC pfnAPC,
    HANDLE hThread,
    ULONG_PTR dwData)
{
    CPalThread * pCurrentThread = NULL;
    CPalThread * pTargetThread = NULL;
    IPalObject * pTargetThreadObject = NULL;
    PAL_ERROR palErr;
    DWORD dwRet;

    PERF_ENTRY(QueueUserAPC);
    ENTRY("QueueUserAPC(pfnAPC=%p, hThread=%p, dwData=%#x)\n",
          pfnAPC, hThread, dwData);

    /* NOTE: Windows does not check the validity of pfnAPC, even if it is
       NULL.  It just does an access violation later on when the APC call
       is attempted */

    pCurrentThread = InternalGetCurrentThread();

    palErr = InternalGetThreadDataFromHandle(
        pCurrentThread,
        hThread,
        0, // THREAD_SET_CONTEXT
        &pTargetThread,
        &pTargetThreadObject
        );

    if (NO_ERROR != palErr)
    {
        ERROR("Unable to obtain thread data for handle %p (error %x)!\n",
                hThread, palErr);
        goto QueueUserAPC_exit;
    }


    palErr = g_pSynchronizationManager->QueueUserAPC(pCurrentThread, pTargetThread,
                                                     pfnAPC, dwData);

QueueUserAPC_exit:
    if (pTargetThreadObject)
    {
        pTargetThreadObject->ReleaseReference(pCurrentThread);
    }

    dwRet = (NO_ERROR == palErr) ? 1 : 0;

    LOGEXIT("QueueUserAPC returns DWORD %d\n", dwRet);
    PERF_EXIT(QueueUserAPC);
    return dwRet;
}